

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O1

void __thiscall gvr::MultiTexturedMesh::~MultiTexturedMesh(MultiTexturedMesh *this)

{
  ~MultiTexturedMesh(this);
  operator_delete(this);
  return;
}

Assistant:

MultiTexturedMesh::~MultiTexturedMesh()
{
  delete [] uvt;
}